

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

bool __thiscall wasm::WATParser::Lexer::takeUntilParen(Lexer *this)

{
  bool bVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  while( true ) {
    bVar1 = empty(this);
    if (bVar1) {
      return false;
    }
    bVar1 = peekLParen(this);
    if ((bVar1) || (bVar1 = peekRParen(this), bVar1)) break;
    takeString_abi_cxx11_(&local_40,this);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_40);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_40);
    if (!bVar1) {
      this->pos = this->pos + 1;
      advance(this);
    }
  }
  return true;
}

Assistant:

bool takeUntilParen() {
    while (true) {
      if (empty()) {
        return false;
      }
      if (peekLParen() || peekRParen()) {
        return true;
      }
      // Do not count the parentheses in strings.
      if (takeString()) {
        continue;
      }
      ++pos;
      advance();
    }
  }